

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_transform.c
# Opt level: O1

void gdImageFlipVertical(gdImagePtr im)

{
  byte bVar1;
  int **ppiVar2;
  int *piVar3;
  int *piVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  
  iVar6 = im->sy;
  if (im->trueColor == 0) {
    if (1 < iVar6) {
      lVar5 = 0;
      do {
        if (0 < im->sx) {
          ppiVar2 = im->tpixels;
          piVar3 = ppiVar2[lVar5];
          lVar7 = 0;
          do {
            bVar1 = *(byte *)(piVar3 + lVar7);
            piVar3[lVar7] = ppiVar2[(int)(im->sy + ~(uint)lVar5)][lVar7];
            ppiVar2[(int)(im->sy + ~(uint)lVar5)][lVar7] = (uint)bVar1;
            lVar7 = lVar7 + 1;
          } while (lVar7 < im->sx);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < im->sy / 2);
    }
  }
  else if (1 < iVar6) {
    ppiVar2 = im->tpixels;
    lVar5 = 0;
    do {
      if (0 < im->sx) {
        piVar3 = ppiVar2[lVar5];
        piVar4 = ppiVar2[(int)(iVar6 + ~(uint)lVar5)];
        lVar7 = 0;
        do {
          iVar6 = piVar3[lVar7];
          piVar3[lVar7] = ppiVar2[(int)(im->sy + ~(uint)lVar5)][lVar7];
          piVar4[lVar7] = iVar6;
          lVar7 = lVar7 + 1;
        } while (lVar7 < im->sx);
      }
      lVar5 = lVar5 + 1;
      iVar6 = im->sy;
    } while (lVar5 < iVar6 / 2);
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageFlipVertical(gdImagePtr im)
{
	register int x, y;

	if (im->trueColor) {
		for (y = 0; y < im->sy / 2; y++) {
			int *row_dst = im->tpixels[y];
			int *row_src = im->tpixels[im->sy - 1 - y];
			for (x = 0; x < im->sx; x++) {
				register int p;
				p = row_dst[x];
				row_dst[x] = im->tpixels[im->sy - 1 - y][x];
				row_src[x] = p;
			}
		}
	} else {
		unsigned char p;
		for (y = 0; y < im->sy / 2; y++) {
			for (x = 0; x < im->sx; x++) {
				p = im->tpixels[y][x];
				im->tpixels[y][x] =	im->tpixels[im->sy - 1 - y][x];
				im->tpixels[im->sy - 1 - y][x] = p;
			}
		}
	}
	return;
}